

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void complete_delete_test(void)

{
  size_t sVar1;
  char valuebuf [256];
  char keybuf [256];
  char path [256];
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_iterator *fit;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffa18;
  undefined2 uVar2;
  undefined2 in_stack_fffffffffffffa1a;
  undefined2 uVar3;
  undefined4 in_stack_fffffffffffffa1c;
  fdb_kvs_handle *in_stack_fffffffffffffa28;
  fdb_kvs_handle *in_stack_fffffffffffffa38;
  char *in_stack_fffffffffffffa40;
  fdb_kvs_handle *in_stack_fffffffffffffa48;
  char *key;
  fdb_kvs_handle *in_stack_fffffffffffffa58;
  undefined1 local_590 [248];
  char local_498 [88];
  fdb_kvs_config *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  fdb_kvs_handle **in_stack_fffffffffffffbd0;
  fdb_file_handle *in_stack_fffffffffffffbd8;
  fdb_config *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  fdb_file_handle **in_stack_fffffffffffffc48;
  char local_398 [256];
  char local_298 [268];
  fdb_status local_18c;
  undefined1 local_170 [8];
  undefined8 local_168;
  fdb_iterator *local_78;
  fdb_kvs_handle *local_70;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_5c = 1000;
  memleak_start();
  sprintf(local_298,"./dummy1");
  local_58 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_170,local_590,0xf8);
  local_168 = 0;
  fdb_get_default_kvs_config();
  fdb_open(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  local_18c = fdb_kvs_open(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                           in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2d0);
    complete_delete_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2d0,"void complete_delete_test()");
    }
  }
  local_54 = 0;
  do {
    if (local_5c <= (int)local_54) {
      fdb_commit((fdb_file_handle *)
                 CONCAT44(in_stack_fffffffffffffa1c,
                          CONCAT22(in_stack_fffffffffffffa1a,in_stack_fffffffffffffa18)),'\0');
      local_54 = 0;
      do {
        if (local_5c <= (int)local_54) {
          fdb_commit((fdb_file_handle *)
                     CONCAT44(in_stack_fffffffffffffa1c,
                              CONCAT22(in_stack_fffffffffffffa1a,in_stack_fffffffffffffa18)),'\0');
          uVar2 = 2;
          uVar3 = 0;
          local_18c = fdb_iterator_init(local_70,&local_78,(void *)0x0,0,(void *)0x0,0,2);
          if (local_18c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2e3);
            complete_delete_test::__test_pass = 0;
            if (local_18c != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x2e3,"void complete_delete_test()");
            }
          }
          local_18c = fdb_iterator_close((fdb_iterator *)in_stack_fffffffffffffa28);
          if (local_18c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2e5);
            complete_delete_test::__test_pass = 0;
            if (local_18c != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x2e5,"void complete_delete_test()");
            }
          }
          fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffa1c,CONCAT22(uVar3,uVar2)));
          fdb_shutdown();
          memleak_end();
          if (complete_delete_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","complete delete");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","complete delete");
          }
          return;
        }
        sprintf(local_398,"key%05d",(ulong)local_54);
        sprintf(local_498,"value%05d",(ulong)local_54);
        in_stack_fffffffffffffa28 = local_70;
        strlen(local_398);
        local_18c = fdb_del_kv(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                               (size_t)in_stack_fffffffffffffa38);
        if (local_18c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x2de);
          complete_delete_test::__test_pass = 0;
          if (local_18c != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x2de,"void complete_delete_test()");
          }
        }
        local_54 = local_54 + 1;
      } while( true );
    }
    sprintf(local_398,"key%05d",(ulong)local_54);
    sprintf(local_498,"value%05d",(ulong)local_54);
    in_stack_fffffffffffffa40 = local_398;
    in_stack_fffffffffffffa38 = local_70;
    sVar1 = strlen(local_398);
    in_stack_fffffffffffffa48 = (fdb_kvs_handle *)(sVar1 + 1);
    key = local_498;
    strlen(local_498);
    local_18c = fdb_set_kv(in_stack_fffffffffffffa58,key,(size_t)in_stack_fffffffffffffa48,
                           in_stack_fffffffffffffa40,(size_t)in_stack_fffffffffffffa38);
    if (local_18c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x2d6);
      complete_delete_test::__test_pass = 0;
      if (local_18c != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x2d6,"void complete_delete_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void complete_delete_test()
{
    TEST_INIT();

    int i, r, n = 1000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *fit;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char path[256];
    char keybuf[256], valuebuf[256];

    memleak_start();

    sprintf(path, "./dummy1");

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    fdb_open(&dbfile, path, &config);
    s = fdb_kvs_open(dbfile, &db, "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%05d", i);
        sprintf(valuebuf, "value%05d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf)+1, valuebuf, strlen(valuebuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%05d", i);
        sprintf(valuebuf, "value%05d", i);
        s = fdb_del_kv(db, keybuf, strlen(keybuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("complete delete");
}